

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-calcs.c
# Opt level: O0

wchar_t calc_unlocking_chance(player *p,wchar_t lock_power,_Bool lock_unseen)

{
  wchar_t local_20;
  wchar_t local_1c;
  wchar_t skill;
  _Bool lock_unseen_local;
  wchar_t lock_power_local;
  player *p_local;
  
  local_1c = (p->state).skills[0];
  if ((lock_unseen) || (p->timed[2] != 0)) {
    local_1c = local_1c / 10;
  }
  if ((p->timed[4] != 0) || (p->timed[6] != 0)) {
    local_1c = local_1c / 10;
  }
  if (local_1c + lock_power * -4 < 3) {
    local_20 = L'\x02';
  }
  else {
    local_20 = local_1c + lock_power * -4;
  }
  return local_20;
}

Assistant:

int calc_unlocking_chance(const struct player *p, int lock_power,
		bool lock_unseen)
{
	int skill = p->state.skills[SKILL_DISARM_PHYS];

	if (lock_unseen || p->timed[TMD_BLIND]) {
		skill /= 10;
	}
	if (p->timed[TMD_CONFUSED] || p->timed[TMD_IMAGE]) {
		skill /= 10;
	}

	/* Always allow some chance of unlocking. */
	return MAX(2, skill - 4 * lock_power);
}